

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_buffer.cpp
# Opt level: O2

bool template_image::_AssignmentOperator<unsigned_int>(void)

{
  uchar colorCount_;
  uchar alignment_;
  bool bVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  EVP_PKEY_CTX *src;
  uint uVar5;
  ImageTemplate<unsigned_int> image_copy;
  ImageTemplate<unsigned_int> image;
  
  uVar5 = 0;
  do {
    uVar2 = Test_Helper::runCount();
    if (uVar2 <= uVar5) {
LAB_00131a03:
      return uVar2 <= uVar5;
    }
    uVar3 = rand();
    uVar4 = rand();
    colorCount_ = Test_Helper::randomValue<unsigned_char>('\x01',4);
    alignment_ = Test_Helper::randomValue<unsigned_char>('\x01',0x20);
    PenguinV_Image::ImageTemplate<unsigned_int>::ImageTemplate
              (&image,uVar3 & 0x3ff,uVar4 & 0x3ff,colorCount_,alignment_);
    uVar3 = rand();
    PenguinV_Image::ImageTemplate<unsigned_int>::fill(&image,uVar3 & 0xff);
    PenguinV_Image::ImageTemplate<unsigned_int>::ImageTemplate(&image_copy,0,0,'\x01','\x01');
    PenguinV_Image::ImageTemplate<unsigned_int>::copy(&image_copy,(EVP_PKEY_CTX *)&image,src);
    bVar1 = Unit_Test::equalSize<PenguinV_Image::ImageTemplate<unsigned_int>>(&image,&image_copy);
    if (!bVar1) {
LAB_001319ec:
      PenguinV_Image::ImageTemplate<unsigned_int>::~ImageTemplate(&image_copy);
      PenguinV_Image::ImageTemplate<unsigned_int>::~ImageTemplate(&image);
      goto LAB_00131a03;
    }
    bVar1 = Unit_Test::equalData<unsigned_int>(&image,&image_copy);
    if (!bVar1) goto LAB_001319ec;
    PenguinV_Image::ImageTemplate<unsigned_int>::~ImageTemplate(&image_copy);
    PenguinV_Image::ImageTemplate<unsigned_int>::~ImageTemplate(&image);
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

bool _AssignmentOperator()
    {
        for( uint32_t i = 0; i < Unit_Test::runCount(); ++i ) {
            const uint32_t width      = Unit_Test::randomValue<uint32_t>( 1024 );
            const uint32_t height     = Unit_Test::randomValue<uint32_t>( 1024 );
            const uint8_t  colorCount = Unit_Test::randomValue<uint8_t >( 1, 4 );
            const uint8_t  alignment  = Unit_Test::randomValue<uint8_t >( 1, 32 );

            PenguinV_Image::ImageTemplate < _Type > image( width, height, colorCount, alignment );
            image.fill( static_cast<_Type>( Unit_Test::randomValue<uint8_t>( 256u ) ) );

            PenguinV_Image::ImageTemplate < _Type > image_copy;

            image_copy = image;

            if( !Unit_Test::equalSize( image, image_copy ) || !Unit_Test::equalData( image, image_copy ) )
                return false;
        }

        return true;
    }